

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O0

Vector4d * ins_ekf::QuatMultiply(Vector4d *__return_storage_ptr__,Vector4d *q,Vector4d *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  Vector4d *p_local;
  Vector4d *q_local;
  Vector4d *quat;
  
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix(__return_storage_ptr__);
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,3);
  dVar1 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,0);
  dVar2 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,2);
  dVar3 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,1);
  dVar4 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,1);
  dVar5 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,2);
  dVar6 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,0);
  dVar7 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,3);
  dVar8 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                       __return_storage_ptr__,0);
  *pSVar10 = dVar7 * dVar8 + -dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,2);
  dVar1 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,0);
  dVar2 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,3);
  dVar3 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,1);
  dVar4 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,0);
  dVar5 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,2);
  dVar6 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,1);
  dVar7 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,3);
  dVar8 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                       __return_storage_ptr__,1);
  *pSVar10 = dVar7 * dVar8 + dVar5 * dVar6 + -dVar1 * dVar2 + dVar3 * dVar4;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,1);
  dVar1 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,0);
  dVar2 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,0);
  dVar3 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,1);
  dVar4 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,3);
  dVar5 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,2);
  dVar6 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,2);
  dVar7 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,3);
  dVar8 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                       __return_storage_ptr__,2);
  *pSVar10 = dVar7 * dVar8 + dVar5 * dVar6 + dVar1 * dVar2 + -(dVar3 * dVar4);
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,0);
  dVar1 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,0);
  dVar2 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,1);
  dVar3 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,1);
  dVar4 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,2);
  dVar5 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,2);
  dVar6 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)q,3);
  dVar7 = *pdVar9;
  pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)p,3);
  dVar8 = *pdVar9;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                       __return_storage_ptr__,3);
  *pSVar10 = dVar7 * dVar8 + -dVar5 * dVar6 + -dVar1 * dVar2 + -(dVar3 * dVar4);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector4d QuatMultiply(const Eigen::Vector4d& q, const Eigen::Vector4d& p){

        Eigen::Vector4d quat;

        quat[0] = q[3]*p[0] + q[2]*p[1] - q[1]*p[2] + q[0]*p[3];
        quat[1] = -q[2]*p[0] + q[3]*p[1] + q[0]*p[2] + q[1]*p[3];
        quat[2] = q[1]*p[0] - q[0]*p[1] + q[3]*p[2] + q[2]*p[3];
        quat[3] = -q[0]*p[0] - q[1]*p[1] - q[2]*p[2] + q[3]*p[3];

        return quat;
    }